

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segapcm.c
# Opt level: O3

void SEGAPCM_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  byte bVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  ushort uVar5;
  long lVar6;
  long lVar7;
  undefined1 uVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (*(long *)((long)chip + 0x28) != 0) {
    lVar7 = 0;
    do {
      lVar6 = *(long *)((long)chip + 8);
      bVar11 = *(byte *)(lVar6 + 0x86 + lVar7 * 8);
      if (((bVar11 & 1) == 0) && (*(char *)((long)chip + lVar7 + 0x33) == '\0')) {
        bVar1 = *(byte *)((long)chip + 0x31);
        bVar2 = *(byte *)((long)chip + 0x30);
        uVar9 = (uint)CONCAT21(*(undefined2 *)(lVar6 + 0x84 + lVar7 * 8),
                               *(undefined1 *)((long)chip + lVar7 + 0x10));
        if (samples != 0) {
          uVar5 = *(ushort *)(lVar6 + 4 + lVar7 * 8);
          cVar3 = *(char *)(lVar6 + 6 + lVar7 * 8);
          uVar10 = 0;
          do {
            if (uVar9 >> 0x10 == (uint)(byte)(cVar3 + 1)) {
              bVar4 = *(byte *)(lVar6 + 0x86 + lVar7 * 8);
              uVar12 = (ulong)uVar5 << 8;
              if ((bVar4 & 2) != 0) {
                bVar11 = bVar4 | 1;
                *(byte *)(lVar6 + 0x86 + lVar7 * 8) = bVar11;
                goto LAB_00141f94;
              }
            }
            else {
              uVar12 = (ulong)uVar9;
            }
            uVar9 = (int)*(char *)(*(long *)((long)chip + 0x28) +
                                  (ulong)((uint)(uVar12 >> 8) |
                                         (uint)(bVar1 & bVar11) << (bVar2 & 0x1f))) ^ 0xffffff80;
            (*outputs)[uVar10] =
                 (*outputs)[uVar10] + (*(byte *)(lVar6 + 2 + lVar7 * 8) & 0x7f) * uVar9;
            outputs[1][uVar10] =
                 outputs[1][uVar10] + (*(byte *)(lVar6 + 3 + lVar7 * 8) & 0x7f) * uVar9;
            uVar9 = (uint)*(byte *)(lVar6 + 7 + lVar7 * 8) + (int)uVar12 & 0xffffff;
            uVar10 = uVar10 + 1;
          } while (samples != uVar10);
          bVar11 = *(byte *)(lVar6 + 0x86 + lVar7 * 8);
        }
LAB_00141f94:
        *(char *)(lVar6 + 0x84 + lVar7 * 8) = (char)(uVar9 >> 8);
        *(char *)(lVar6 + 0x85 + lVar7 * 8) = (char)(uVar9 >> 0x10);
        uVar8 = (undefined1)uVar9;
        if ((bVar11 & 1) != 0) {
          uVar8 = 0;
        }
        *(undefined1 *)((long)chip + lVar7 + 0x10) = uVar8;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
  }
  return;
}

Assistant:

static void SEGAPCM_update(void *chip, UINT32 samples, DEV_SMPL **outputs)
{
	segapcm_state *spcm = (segapcm_state *)chip;
	int ch;

	/* clear the buffers */
	memset(outputs[0], 0, samples*sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples*sizeof(DEV_SMPL));
	if (spcm->rom == NULL)
		return;

	// reg      function
	// ------------------------------------------------
	// 0x00     ?
	// 0x01     ?
	// 0x02     volume left
	// 0x03     volume right
	// 0x04     loop address (08-15)
	// 0x05     loop address (16-23)
	// 0x06     end address
	// 0x07     address delta
	// 0x80     ?
	// 0x81     ?
	// 0x82     ?
	// 0x83     ?
	// 0x84     current address (08-15), 00-07 is internal?
	// 0x85     current address (16-23)
	// 0x86     bit 0: channel disable?
	//          bit 1: loop disable
	//          other bits: bank
	// 0x87     ?

	/* loop over channels */
	for (ch = 0; ch < 16; ch++)
	{
		UINT8 *regs = spcm->ram+8*ch;

		/* only process active channels */
		if (!(regs[0x86] & 1) && ! spcm->Muted[ch])
		{
			UINT32 offset = (regs[0x86] & spcm->bankmask) << spcm->bankshift;
			UINT32 addr = (regs[0x85] << 16) | (regs[0x84] << 8) | spcm->low[ch];
			UINT32 loop = (regs[0x05] << 16) | (regs[0x04] << 8);
			UINT8 end = regs[6] + 1;
			UINT32 i;

			/* loop over samples on this channel */
			for (i = 0; i < samples; i++)
			{
				INT8 v = 0;

				/* handle looping if we've hit the end */
				if ((addr >> 16) == end)
				{
					if (regs[0x86] & 2)
					{
						regs[0x86] |= 1;
						break;
					}
					else addr = loop;
				}

				/* fetch the sample */
				v = spcm->rom[offset | (addr >> 8)] - 0x80;
#ifdef _DEBUG
				if ((spcm->romusage[(offset | addr >> 8)] & 0x03) == 0x02 && (regs[2] || regs[3]))
					printf("Access to empty ROM section! (0x%06X)\n", offset | ((addr >> 8)));
				spcm->romusage[offset | (addr >> 8)] |= 0x01;
#endif

				/* apply panning and advance */
				// fixed Bitmask for volume multiplication, thanks to ctr -Valley Bell
				outputs[0][i] += v * (regs[2] & 0x7F);
				outputs[1][i] += v * (regs[3] & 0x7F);
				addr = (addr + regs[7]) & 0xffffff;
			}

			/* store back the updated address */
			regs[0x84] = addr >> 8;
			regs[0x85] = addr >> 16;
			spcm->low[ch] = regs[0x86] & 1 ? 0 : addr;
		}
	}
}